

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Cord __thiscall
google::protobuf::Reflection::GetCord(Reflection *this,Message *message,FieldDescriptor *field)

{
  InternalMetadata *this_00;
  byte bVar1;
  void *pvVar2;
  uint32_t uVar3;
  CppStringType CVar4;
  Cord **ppCVar5;
  string *psVar6;
  ArenaStringPtr *pAVar7;
  Cord *data2;
  CordRep *pCVar8;
  Nonnull<const_char_*> pcVar9;
  bool bVar10;
  FieldDescriptor *in_RCX;
  char *description;
  OneofDescriptor *oneof_descriptor;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar11;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  Descriptor *pDVar12;
  Metadata MVar13;
  Cord CVar14;
  string_view src;
  
  MVar13 = Message::GetMetadata((Message *)field);
  if (MVar13.reflection != (Reflection *)message) {
    pDVar12 = (Descriptor *)(message->super_MessageLite)._vptr_MessageLite;
    MVar13 = Message::GetMetadata((Message *)field);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar12,MVar13.descriptor,in_RCX,"GetCord");
  }
  pDVar12 = (Descriptor *)(message->super_MessageLite)._vptr_MessageLite;
  if (in_RCX->containing_type_ != pDVar12) {
    description = "Field does not match message type.";
    goto LAB_001f54ac;
  }
  bVar1 = in_RCX->field_0x1;
  bVar10 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar10) {
    pcVar9 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar10,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar9 == (Nonnull<const_char_*>)0x0) {
    if ((in_RCX->field_0x1 & 0x20) == 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)in_RCX->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  ((Descriptor *)(message->super_MessageLite)._vptr_MessageLite,in_RCX,"GetCord",
                   CPPTYPE_STRING);
      }
      this_00 = &(message->super_MessageLite)._internal_metadata_;
      if ((in_RCX->field_0x1 & 8) == 0) {
        bVar10 = internal::ReflectionSchema::InRealOneof((ReflectionSchema *)this_00,in_RCX);
        if (bVar10) {
          if ((in_RCX->field_0x1 & 0x10) == 0) {
            oneof_descriptor = (OneofDescriptor *)0x0;
          }
          else {
            oneof_descriptor = (in_RCX->scope_).containing_oneof;
            if (oneof_descriptor == (OneofDescriptor *)0x0) goto LAB_001f54d1;
          }
          uVar3 = GetOneofCase((Reflection *)message,(Message *)field,oneof_descriptor);
          if (uVar3 == in_RCX->number_) goto LAB_001f5347;
LAB_001f53c3:
          psVar6 = (in_RCX->field_20).default_value_string_;
        }
        else {
LAB_001f5347:
          CVar4 = FieldDescriptor::cpp_string_type(in_RCX);
          if ((CVar4 != kView) && (CVar4 != kString)) {
            if (CVar4 != kCord) {
              GetCord();
LAB_001f54d1:
              internal::protobuf_assumption_failed
                        ("res != nullptr",
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb31);
            }
            bVar10 = internal::ReflectionSchema::InRealOneof((ReflectionSchema *)this_00,in_RCX);
            if (bVar10) {
              ppCVar5 = GetRaw<absl::lts_20250127::Cord*>
                                  ((Reflection *)message,(Message *)field,in_RCX);
              data2 = *ppCVar5;
              bVar1 = (data2->contents_).data_.rep_.field_0.data[0];
              pCVar8 = (data2->contents_).data_.rep_.field_0.as_tree.rep;
              uVar11 = extraout_RDX;
            }
            else {
              data2 = GetRaw<absl::lts_20250127::Cord>
                                ((Reflection *)message,(Message *)field,in_RCX);
              bVar1 = (data2->contents_).data_.rep_.field_0.data[0];
              pCVar8 = (data2->contents_).data_.rep_.field_0.as_tree.rep;
              uVar11 = extraout_RDX_01;
            }
            bVar10 = (bVar1 & 1) == 0;
            uVar11 = CONCAT71((int7)((ulong)uVar11 >> 8),pCVar8 == (CordRep *)0x0 || bVar10);
            if (pCVar8 == (CordRep *)0x0 || bVar10) {
              pCVar8 = (data2->contents_).data_.rep_.field_0.as_tree.rep;
              this->descriptor_ =
                   (Descriptor *)(data2->contents_).data_.rep_.field_0.as_tree.cordz_info;
              (this->schema_).default_instance_ = (Message *)pCVar8;
            }
            else {
              LOCK();
              (pCVar8->refcount).count_.super___atomic_base<int> =
                   (__atomic_base<int>)
                   ((__int_type_conflict2)(pCVar8->refcount).count_.super___atomic_base<int> + 2);
              UNLOCK();
              (this->schema_).default_instance_ = (Message *)pCVar8;
              this->descriptor_ = (Descriptor *)0x1;
              bVar10 = absl::lts_20250127::cord_internal::InlineData::is_either_profiled
                                 ((InlineData *)this,(InlineData *)data2);
              uVar11 = extraout_RDX_02;
              if (bVar10) {
                absl::lts_20250127::cord_internal::CordzInfo::MaybeTrackCordImpl
                          ((InlineData *)this,(InlineData *)data2,kConstructorCord);
                uVar11 = extraout_RDX_03;
              }
            }
            goto LAB_001f53db;
          }
          bVar10 = internal::ReflectionSchema::IsFieldInlined((ReflectionSchema *)this_00,in_RCX);
          if (bVar10) {
            psVar6 = (string *)
                     GetRaw<google::protobuf::internal::InlinedStringField>
                               ((Reflection *)message,(Message *)field,in_RCX);
          }
          else {
            pAVar7 = GetRaw<google::protobuf::internal::ArenaStringPtr>
                               ((Reflection *)message,(Message *)field,in_RCX);
            pvVar2 = (pAVar7->tagged_ptr_).ptr_;
            if (((ulong)pvVar2 & 3) == 0) goto LAB_001f53c3;
            psVar6 = (string *)((ulong)pvVar2 & 0xfffffffffffffffc);
          }
        }
      }
      else {
        uVar3 = internal::ReflectionSchema::GetExtensionSetOffset((ReflectionSchema *)this_00);
        psVar6 = internal::ExtensionSet::GetString
                           ((ExtensionSet *)(&field->super_SymbolBase + uVar3),in_RCX->number_,
                            (in_RCX->field_20).default_value_string_);
      }
      src._M_str = (psVar6->_M_dataplus)._M_p;
      src._M_len = psVar6->_M_string_length;
      absl::lts_20250127::Cord::Cord((Cord *)this,src,kConstructorString);
      uVar11 = extraout_RDX_00;
LAB_001f53db:
      CVar14.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)uVar11;
      CVar14.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
      return (Cord)CVar14.contents_.data_.rep_.field_0;
    }
  }
  else {
    GetCord();
  }
  pDVar12 = (Descriptor *)(message->super_MessageLite)._vptr_MessageLite;
  description = "Field is repeated; the method requires a singular field.";
LAB_001f54ac:
  anon_unknown_6::ReportReflectionUsageError(pDVar12,in_RCX,"GetCord",description);
}

Assistant:

absl::Cord Reflection::GetCord(const Message& message,
                               const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(GetCord, SINGULAR, STRING);
  if (field->is_extension()) {
    return absl::Cord(GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field)));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return absl::Cord(field->default_value_string());
    }
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          return *GetField<absl::Cord*>(message, field);
        } else {
          return GetField<absl::Cord>(message, field);
        }
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        if (IsInlined(field)) {
          return absl::Cord(
              GetField<InlinedStringField>(message, field).GetNoArena());
        } else if (IsMicroString(field)) {
          return absl::Cord(GetField<MicroString>(message, field).Get());
        } else {
          const auto& str = GetField<ArenaStringPtr>(message, field);
          return absl::Cord(str.IsDefault() ? field->default_value_string()
                                            : str.Get());
        }
    }
    internal::Unreachable();
  }
}